

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.c
# Opt level: O2

void init_vertices(void)

{
  uint uVar1;
  int iVar2;
  GLfloat *pGVar3;
  GLuint *pGVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  GLfloat *pGVar8;
  long lVar9;
  GLuint *pGVar10;
  GLfloat GVar11;
  
  pGVar3 = &vertex[0].b;
  for (lVar7 = 0; uVar5 = (uint)lVar7, lVar7 != 0x32; lVar7 = lVar7 + 1) {
    pGVar8 = pGVar3;
    for (lVar9 = 0; lVar9 != 0x32; lVar9 = lVar9 + 1) {
      uVar1 = (uint)lVar9;
      ((Vertex *)(pGVar8 + -5))->x = (float)(int)(uVar1 - 0x19) / 25.0;
      pGVar8[-4] = (float)(int)(uVar5 - 0x19) / 25.0;
      pGVar8[-3] = 0.0;
      GVar11 = 1.0;
      if (((uVar1 ^ uVar5) & 2) != 0) {
        GVar11 = 0.0;
      }
      pGVar8[-2] = GVar11;
      pGVar8[-1] = (float)(int)uVar5 / 50.0;
      *pGVar8 = ((float)(int)uVar1 / 50.0 + (float)(int)uVar5 / 50.0) * -0.5 + 1.0;
      pGVar8 = pGVar8 + 6;
    }
    pGVar3 = pGVar3 + 300;
  }
  pGVar4 = quad + 3;
  iVar6 = 0;
  for (lVar7 = 0; pGVar10 = pGVar4, lVar9 = -0x31, lVar7 != 0x31; lVar7 = lVar7 + 1) {
    for (; lVar9 != 0; lVar9 = lVar9 + 1) {
      iVar2 = (int)lVar9;
      pGVar10[-3] = iVar6 + iVar2 + 0x31;
      pGVar10[-2] = iVar6 + 0x32 + iVar2;
      pGVar10[-1] = iVar6 + 100 + iVar2;
      *pGVar10 = iVar6 + iVar2 + 99;
      pGVar10 = pGVar10 + 4;
    }
    pGVar4 = pGVar4 + 0xc4;
    iVar6 = iVar6 + 0x32;
  }
  return;
}

Assistant:

void init_vertices(void)
{
    int x, y, p;

    // Place the vertices in a grid
    for (y = 0;  y < GRIDH;  y++)
    {
        for (x = 0;  x < GRIDW;  x++)
        {
            p = y * GRIDW + x;

            vertex[p].x = (GLfloat) (x - GRIDW / 2) / (GLfloat) (GRIDW / 2);
            vertex[p].y = (GLfloat) (y - GRIDH / 2) / (GLfloat) (GRIDH / 2);
            vertex[p].z = 0;

            if ((x % 4 < 2) ^ (y % 4 < 2))
                vertex[p].r = 0.0;
            else
                vertex[p].r = 1.0;

            vertex[p].g = (GLfloat) y / (GLfloat) GRIDH;
            vertex[p].b = 1.f - ((GLfloat) x / (GLfloat) GRIDW + (GLfloat) y / (GLfloat) GRIDH) / 2.f;
        }
    }

    for (y = 0;  y < QUADH;  y++)
    {
        for (x = 0;  x < QUADW;  x++)
        {
            p = 4 * (y * QUADW + x);

            quad[p + 0] = y       * GRIDW + x;     // Some point
            quad[p + 1] = y       * GRIDW + x + 1; // Neighbor at the right side
            quad[p + 2] = (y + 1) * GRIDW + x + 1; // Upper right neighbor
            quad[p + 3] = (y + 1) * GRIDW + x;     // Upper neighbor
        }
    }
}